

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  _Bool _Var1;
  int n;
  uint needle;
  char *__format;
  
  printf("Array is [%d, %d, %d, %d, %d].\n",1,2,4,4,5);
  for (needle = 1; needle != 6; needle = needle + 1) {
    _Var1 = is_in_array((int *)&DAT_00102010,5,needle);
    __format = "%d is not in the array.\n";
    if (_Var1) {
      __format = "%d is in the array.\n";
    }
    printf(__format,(ulong)needle);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const int arr[ARR_LEN] = {1, 2, 4, 4, 5};
  printf("Array is [%d, %d, %d, %d, %d].\n", arr[0], arr[1], arr[2], arr[3], arr[4]);

  for (int n = 1; n <= 5; n++) {
    if (is_in_array(arr, ARR_LEN, n)) {
      printf("%d is in the array.\n", n);
    } else {
      printf("%d is not in the array.\n", n);
    }
  }

  return 0;
}